

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O1

void Fl_Text_Display::buffer_modified_cb
               (int pos,int nInserted,int nDeleted,int nRestyled,char *deletedText,void *cbArg)

{
  Fl_Text_Buffer *this;
  int iVar1;
  char *c;
  char *pcVar2;
  int iVar3;
  int iVar4;
  char *c_1;
  int lineCount;
  bool bVar5;
  int endDispPos;
  int linesDeleted;
  int linesInserted;
  int wrapModEnd;
  int wrapModStart;
  int scrolled;
  int startDispPos;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  Fl_Text_Buffer *local_50;
  ulong local_48;
  int local_3c;
  int local_38;
  int local_34;
  
  local_48 = (ulong)(uint)nInserted;
  local_50 = *(Fl_Text_Buffer **)((long)cbArg + 0xd0);
  local_34 = *(int *)((long)cbArg + 0xe0);
  local_38 = *(int *)((long)cbArg + 0xb0);
  local_5c = 0;
  local_60 = 0;
  if (nDeleted != 0 || nInserted != 0) {
    *(undefined4 *)((long)cbArg + 0xc4) = 0xffffffff;
  }
  local_3c = nRestyled;
  if (*(int *)((long)cbArg + 0xe8) == 0) {
    iVar3 = 0;
    local_64 = 0;
    if (nInserted != 0) {
      local_64 = Fl_Text_Buffer::count_lines(local_50,pos,nInserted + pos);
    }
    if (deletedText != (char *)0x0 && nDeleted != 0) {
      iVar3 = 0;
      pcVar2 = deletedText;
      do {
        if (*pcVar2 == '\n') {
          iVar3 = iVar3 + 1;
        }
        else if (*pcVar2 == '\0') break;
        pcVar2 = pcVar2 + 1;
      } while( true );
    }
    iVar4 = (int)local_48;
    local_68 = iVar3;
  }
  else {
    find_wrap_range((Fl_Text_Display *)cbArg,deletedText,pos,nInserted,nDeleted,&local_5c,&local_60,
                    &local_64,&local_68);
    iVar4 = nInserted;
  }
  if (nDeleted == 0 && nInserted == 0) {
    local_58 = 0;
  }
  else {
    iVar3 = nDeleted;
    iVar1 = pos;
    if (*(int *)((long)cbArg + 0xe8) != 0) {
      iVar3 = (nDeleted - local_5c) - iVar4;
      iVar4 = local_60 - local_5c;
      iVar3 = iVar3 + local_60;
      iVar1 = local_5c;
    }
    update_line_starts((Fl_Text_Display *)cbArg,iVar1,iVar4,iVar3,local_64,local_68,&local_58);
  }
  if (*(int *)((long)cbArg + 0xe8) == 0) {
    bVar5 = true;
  }
  else if (*(int *)((long)cbArg + 0x1a4) == 0) {
    bVar5 = *(int *)((long)cbArg + 0x100) == 0;
  }
  else {
    bVar5 = false;
  }
  if ((nDeleted != 0 || nInserted != 0) && (!bVar5)) {
    if (pos + nDeleted < local_34 && deletedText != (char *)0x0) {
      iVar3 = Fl_Text_Buffer::count_lines(local_50,pos,(int)local_48 + pos);
      iVar4 = 0;
      do {
        if (*deletedText == '\n') {
          iVar4 = iVar4 + 1;
        }
        else if (*deletedText == '\0') goto LAB_001d109b;
        deletedText = deletedText + 1;
      } while( true );
    }
    if (pos < local_34) {
      *(undefined4 *)((long)cbArg + 0xfc) = 1;
      absolute_top_line_number((Fl_Text_Display *)cbArg,0);
    }
  }
LAB_001d10be:
  iVar4 = local_64;
  iVar3 = local_68;
  *(int *)((long)cbArg + 0xcc) = *(int *)((long)cbArg + 0xcc) + (local_64 - local_68);
  if (*(int *)((long)cbArg + 0xbc) == -1) {
    iVar1 = *(int *)((long)cbArg + 0xb0);
    if (pos < iVar1) {
      if (iVar1 < pos + nDeleted) {
        *(int *)((long)cbArg + 0xb0) = pos;
      }
      else {
        *(int *)((long)cbArg + 0xb0) = ((int)local_48 - nDeleted) + iVar1;
      }
    }
  }
  else {
    *(int *)((long)cbArg + 0xb0) = *(int *)((long)cbArg + 0xbc);
    *(undefined4 *)((long)cbArg + 0xbc) = 0xffffffff;
  }
  (**(code **)(*cbArg + 0x20))
            (cbArg,*(undefined4 *)((long)cbArg + 0x20),*(undefined4 *)((long)cbArg + 0x24),
             *(undefined4 *)((long)cbArg + 0x28),*(undefined4 *)((long)cbArg + 0x2c));
  iVar1 = Fl_Widget::visible_r((Fl_Widget *)cbArg);
  if (iVar1 != 0) {
    if (local_58 == 0) {
      iVar1 = pos;
      if (*(int *)((long)cbArg + 0xe8) != 0) {
        iVar1 = local_5c;
      }
      local_54 = iVar1;
      if (((local_38 == iVar1) && (*(int *)((long)cbArg + 0xb0) != iVar1)) &&
         (local_54 = Fl_Text_Buffer::prev_char_clipped(local_50,local_38), iVar1 < local_54)) {
        local_54 = iVar1;
      }
      this = local_50;
      if (iVar4 == iVar3) {
        if (nDeleted == 0 && nInserted == 0) {
          local_6c = local_3c + pos;
        }
        else {
          local_6c = local_60;
          if (*(int *)((long)cbArg + 0xe8) == 0) {
            iVar3 = Fl_Text_Buffer::line_end(local_50,(int)local_48 + pos);
            local_6c = Fl_Text_Buffer::next_char(this,iVar3);
          }
        }
        if (1 < iVar4) {
          Fl_Widget::damage((Fl_Widget *)cbArg,'\x02');
        }
      }
      else {
        local_6c = Fl_Text_Buffer::next_char(local_50,*(int *)((long)cbArg + 0xe4));
      }
      if (*(long *)((long)cbArg + 0xd8) != 0) {
        extend_range_for_styles((Fl_Text_Display *)cbArg,&local_54,&local_6c);
      }
      redisplay_range((Fl_Text_Display *)cbArg,local_54,local_6c);
      return;
    }
    Fl_Widget::damage((Fl_Widget *)cbArg,'\x02');
    if (*(long *)((long)cbArg + 0xd8) != 0) {
      *(undefined1 *)(*(long *)((long)cbArg + 0xd8) + 0x18) = 0;
    }
  }
  return;
LAB_001d109b:
  *(int *)((long)cbArg + 0xfc) = *(int *)((long)cbArg + 0xfc) + (iVar3 - iVar4);
  goto LAB_001d10be;
}

Assistant:

void Fl_Text_Display::buffer_modified_cb( int pos, int nInserted, int nDeleted,
                                         int nRestyled, const char *deletedText, void *cbArg ) {
  int linesInserted, linesDeleted, startDispPos, endDispPos;
  Fl_Text_Display *textD = ( Fl_Text_Display * ) cbArg;
  Fl_Text_Buffer *buf = textD->mBuffer;
  int oldFirstChar = textD->mFirstChar;
  int scrolled, origCursorPos = textD->mCursorPos;
  int wrapModStart = 0, wrapModEnd = 0;

  IS_UTF8_ALIGNED2(buf, pos)
  IS_UTF8_ALIGNED2(buf, oldFirstChar)

  /* buffer modification cancels vertical cursor motion column */
  if ( nInserted != 0 || nDeleted != 0 )
    textD->mCursorPreferredXPos = -1;

  /* Count the number of lines inserted and deleted, and in the case
   of continuous wrap mode, how much has changed */
  if (textD->mContinuousWrap) {
    textD->find_wrap_range(deletedText, pos, nInserted, nDeleted,
                           &wrapModStart, &wrapModEnd, &linesInserted, &linesDeleted);
  } else {
    linesInserted = nInserted == 0 ? 0 : buf->count_lines( pos, pos + nInserted );
    linesDeleted = nDeleted == 0 ? 0 : countlines( deletedText );
  }

  /* Update the line starts and mTopLineNum */
  if ( nInserted != 0 || nDeleted != 0 ) {
    if (textD->mContinuousWrap) {
      textD->update_line_starts( wrapModStart, wrapModEnd-wrapModStart,
                                nDeleted + pos-wrapModStart + (wrapModEnd-(pos+nInserted)),
                                linesInserted, linesDeleted, &scrolled );
    } else {
      textD->update_line_starts( pos, nInserted, nDeleted, linesInserted,
                                linesDeleted, &scrolled );
    }
  } else
    scrolled = 0;

  /* If we're counting non-wrapped lines as well, maintain the absolute
   (non-wrapped) line number of the text displayed */
  if (textD->maintaining_absolute_top_line_number() &&
      (nInserted != 0 || nDeleted != 0)) {
    if (deletedText && (pos + nDeleted < oldFirstChar))
      textD->mAbsTopLineNum += buf->count_lines(pos, pos + nInserted) -
                               countlines(deletedText);
    else if (pos < oldFirstChar)
      textD->reset_absolute_top_line_number();
  }

  /* Update the line count for the whole buffer */
  textD->mNBufferLines += linesInserted - linesDeleted;

  /* Update the cursor position */
  if ( textD->mCursorToHint != NO_HINT ) {
    textD->mCursorPos = textD->mCursorToHint;
    textD->mCursorToHint = NO_HINT;
  } else if ( textD->mCursorPos > pos ) {
    if ( textD->mCursorPos < pos + nDeleted )
      textD->mCursorPos = pos;
    else
      textD->mCursorPos += nInserted - nDeleted;
  }

  // refigure scrollbars & stuff
  textD->resize(textD->x(), textD->y(), textD->w(), textD->h());

  // don't need to do anything else if not visible?
  if (!textD->visible_r()) return;

  /* If the changes caused scrolling, re-paint everything and we're done. */
  if ( scrolled ) {
    textD->damage(FL_DAMAGE_EXPOSE);
    if ( textD->mStyleBuffer )   /* See comments in extendRangeForStyleMods */
      textD->mStyleBuffer->primary_selection()->selected(0);
    return;
  }

  /* If the changes didn't cause scrolling, decide the range of characters
   that need to be re-painted.  Also if the cursor position moved, be
   sure that the redisplay range covers the old cursor position so the
   old cursor gets erased, and erase the bits of the cursor which extend
   beyond the left and right edges of the text. */
  startDispPos = textD->mContinuousWrap ? wrapModStart : pos;
  IS_UTF8_ALIGNED2(buf, startDispPos)

  if ( origCursorPos == startDispPos && textD->mCursorPos != startDispPos )
    startDispPos = min( startDispPos, buf->prev_char_clipped(origCursorPos) );
  IS_UTF8_ALIGNED2(buf, startDispPos)

  if ( linesInserted == linesDeleted ) {
    if ( nInserted == 0 && nDeleted == 0 )
      endDispPos = pos + nRestyled;
    else {
      if (textD->mContinuousWrap)
        endDispPos = wrapModEnd;
      else
        endDispPos = buf->next_char(buf->line_end( pos + nInserted ));

      // CET - FIXME      if ( origCursorPos >= startDispPos &&
      //                ( origCursorPos <= endDispPos || endDispPos == buf->length() ) )
    }
    if (linesInserted > 1) {
      // textD->draw_line_numbers(false); // can't do this b/c not called from virtual draw();
      textD->damage(::FL_DAMAGE_EXPOSE);
    }
  } else {
    endDispPos = buf->next_char(textD->mLastChar);
    // CET - FIXME   if ( origCursorPos >= pos )
    /* If more than one line is inserted/deleted, a line break may have
     been inserted or removed in between, and the line numbers may
     have changed. If only one line is altered, line numbers cannot
     be affected (the insertion or removal of a line break always
     results in at least two lines being redrawn). */
    
    // Call draw_line_numbers() here to ensure line# is drawn
    // when hitting enter for new line -- LZA / STR #2621
    //textD->draw_line_numbers(true);    // no, can't call this here, not in draw() context -- ERCO / STR#2621
    //textD->damage(::FL_DAMAGE_EXPOSE);
  }
  IS_UTF8_ALIGNED2(buf, startDispPos)
  IS_UTF8_ALIGNED2(buf, endDispPos)

  /* If there is a style buffer, check if the modification caused additional
   changes that need to be redisplayed.  (Redisplaying separately would
   cause double-redraw on almost every modification involving styled
   text).  Extend the redraw range to incorporate style changes */
  if ( textD->mStyleBuffer )
    textD->extend_range_for_styles( &startDispPos, &endDispPos );
  IS_UTF8_ALIGNED2(buf, startDispPos)
  IS_UTF8_ALIGNED2(buf, endDispPos)

  /* Redisplay computed range */
  textD->redisplay_range( startDispPos, endDispPos );
}